

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O1

void it<bool(*)()>(string *name,_func_bool *f)

{
  bool bVar1;
  ostream *poVar2;
  long lVar3;
  char *pcVar4;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"It ",3);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(name->_M_dataplus)._M_p,name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"...",3);
  bVar1 = (*f)();
  if (bVar1) {
    pcVar4 = " [Pass]";
    lVar3 = 7;
  }
  else {
    pcVar4 = " [Failed]";
    lVar3 = 9;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar4,lVar3);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  return;
}

Assistant:

void it(const std::string &name, TestFunc f, Args... args) {
    std::cout << "It " << name << "...";
    if (f(args...)) {
        std::cout << " [Pass]";
    } else {
        std::cout << " [Failed]";
    }
    std::cout << std::endl;
}